

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionBody::AddEntryPointToEntryPointList
          (FunctionBody *this,FunctionEntryPointInfo *entryPointInfo)

{
  Type pSVar1;
  ThreadContext *pTVar2;
  Recycler *recycler;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *this_00;
  Type TVar3;
  RecyclerWeakReferenceBase *local_40;
  bool local_31;
  
  pSVar1 = (this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext;
  pTVar2 = pSVar1->threadContext;
  local_31 = pTVar2->disableExpiration;
  pTVar2->disableExpiration = true;
  recycler = pSVar1->recycler;
  this_00 = (this->entryPoints).ptr;
  local_40 = Memory::WeakReferenceHashTable<PrimePolicy>::Add
                       (&recycler->weakReferenceMap,(char *)entryPointInfo,recycler);
  if (local_40->typeInfo == (Type)0x0) {
    local_40->typeInfo = (Type)&FunctionEntryPointInfo::typeinfo;
    Memory::Recycler::TrackAllocWeakRef(recycler,local_40);
  }
  TVar3 = SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
          ::Add(this_00,(RecyclerWeakReference<Js::FunctionEntryPointInfo> **)&local_40);
  entryPointInfo->entryPointIndex = TVar3;
  pTVar2->disableExpiration = local_31;
  return;
}

Assistant:

void FunctionBody::AddEntryPointToEntryPointList(FunctionEntryPointInfo* entryPointInfo)
    {
        ThreadContext::AutoDisableExpiration disableExpiration(this->m_scriptContext->GetThreadContext());

        Recycler* recycler = this->m_scriptContext->GetRecycler();
        entryPointInfo->entryPointIndex = this->entryPoints->Add(recycler->CreateWeakReferenceHandle(entryPointInfo));
    }